

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_OptionalLabelProto3_Test::
ParseMessageTest_OptionalLabelProto3_Test(ParseMessageTest_OptionalLabelProto3_Test *this)

{
  ParseMessageTest_OptionalLabelProto3_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseMessageTest);
  (this->super_ParseMessageTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseMessageTest_OptionalLabelProto3_Test_02a0b328;
  return;
}

Assistant:

TEST_F(ParseMessageTest, OptionalLabelProto3) {
  ExpectParsesTo(
      "syntax = \"proto3\";\n"
      "message TestMessage {\n"
      "  int32 foo = 1;\n"
      "}\n",

      "syntax: \"proto3\" "
      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"foo\" label:LABEL_OPTIONAL type:TYPE_INT32 number:1 } "
      "}");
}